

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_image_atomic_r64_compact
          (Impl *this,SPIRVModule *module,bool array,bool non_uniform)

{
  initializer_list<unsigned_int> __l;
  Id IVar1;
  Id id;
  Id id_00;
  Id id_01;
  Id IVar2;
  Function *this_00;
  Block *pBVar3;
  Block *this_01;
  Block *this_02;
  Block *this_03;
  Block *this_04;
  Block *thenBlock;
  Block *mergeBlock;
  Block *bp;
  Block *elseBlock;
  pointer pIVar4;
  pointer pIVar5;
  int iVar6;
  size_t sVar7;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_228;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_220;
  undefined4 local_218;
  Id local_214;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_210;
  __single_object atomic_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_200;
  __single_object texel;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1f0;
  Id local_1e8;
  Id local_1e4;
  Id or_op_id;
  Id elect_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1d8;
  __single_object elect;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1c8;
  __single_object or_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1b8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1b0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1a8;
  Id local_1a0;
  undefined4 local_19c;
  Id cond_id;
  __single_object store;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_188;
  __single_object all_equal;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_178;
  __single_object compare_coord;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_168;
  __single_object first;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_158;
  Id local_14c;
  undefined4 local_148;
  Id inot_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_140;
  __single_object inot;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_130;
  __single_object load;
  Id var_is_done;
  Block *elect_merge_block;
  Block *elect_block;
  Block *write_merge_block;
  Block *write_block;
  Block *loop_continue_block;
  Block *loop_body_block;
  Block *loop_merge_block;
  Block *merge_block;
  Block *body_block;
  Id active;
  Id value;
  Id coord;
  Id image_ptr;
  allocator_type local_a9;
  Id local_a8;
  Id local_a4;
  Id local_a0;
  Id local_9c;
  iterator local_98;
  undefined8 local_90;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_88;
  Function *local_70;
  Function *func;
  Id ptr_atomic_type;
  Id u64_type;
  Id bvec_type;
  Id coord_type;
  Id int_type;
  Id bool_type;
  Block *entry;
  Id ptr_image_type;
  Id image_type;
  Block *current_build_point;
  char *name;
  Id *call_id;
  bool non_uniform_local;
  SPIRVModule *pSStack_20;
  bool array_local;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (array) {
    if (non_uniform) {
      name = (char *)&this->image_r64_array_atomic_non_uniform_call_id;
      current_build_point = (Block *)anon_var_dwarf_2fb81c;
    }
    else {
      name = (char *)&this->image_r64_array_atomic_call_id;
      current_build_point = (Block *)anon_var_dwarf_2fb835;
    }
  }
  else if (non_uniform) {
    name = (char *)&this->image_r64_atomic_non_uniform_call_id;
    current_build_point = (Block *)anon_var_dwarf_2fb840;
  }
  else {
    name = (char *)&this->image_r64_atomic_call_id;
    current_build_point = (Block *)anon_var_dwarf_2fb859;
  }
  if (*(int *)name == 0) {
    call_id._6_1_ = non_uniform;
    call_id._7_1_ = array;
    pSStack_20 = module;
    module_local = (SPIRVModule *)this;
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformArithmetic);
    _ptr_image_type = spv::Builder::getBuildPoint(&this->builder);
    IVar1 = spv::Builder::makeUintType(&this->builder,0x40);
    entry._4_4_ = spv::Builder::makeImageType
                            (&this->builder,IVar1,Dim2D,false,(bool)(call_id._7_1_ & 1),false,2,
                             ImageFormatR64ui);
    entry._0_4_ = spv::Builder::makePointer(&this->builder,StorageClassUniformConstant,entry._4_4_);
    _int_type = (Block *)0x0;
    coord_type = spv::Builder::makeBoolType(&this->builder);
    bvec_type = spv::Builder::makeIntType(&this->builder,0x20);
    iVar6 = 2;
    if ((call_id._7_1_ & 1) != 0) {
      iVar6 = 3;
    }
    u64_type = spv::Builder::makeVectorType(&this->builder,bvec_type,iVar6);
    iVar6 = 2;
    if ((call_id._7_1_ & 1) != 0) {
      iVar6 = 3;
    }
    ptr_atomic_type = spv::Builder::makeVectorType(&this->builder,coord_type,iVar6);
    func._4_4_ = spv::Builder::makeUintType(&this->builder,0x40);
    func._0_4_ = spv::Builder::makePointer(&this->builder,StorageClassImage,func._4_4_);
    IVar1 = spv::Builder::makeVoidType(&this->builder);
    pBVar3 = current_build_point;
    local_a8 = (Id)entry;
    local_a4 = u64_type;
    local_a0 = func._4_4_;
    local_9c = coord_type;
    local_98 = &local_a8;
    local_90 = 4;
    __l._M_len = 4;
    __l._M_array = local_98;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_88,__l,&local_a9);
    memset(&coord,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)&coord);
    this_00 = spv::Builder::makeFunctionEntry
                        (&this->builder,DecorationMax,IVar1,(char *)pBVar3,&local_88,
                         (Vector<dxil_spv::Vector<Decoration>_> *)&coord,(Block **)&int_type);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)&coord);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_88);
    local_70 = this_00;
    id = spv::Function::getParamId(this_00,0);
    id_00 = spv::Function::getParamId(local_70,1);
    id_01 = spv::Function::getParamId(local_70,2);
    IVar1 = spv::Function::getParamId(local_70,3);
    spv::Builder::addName(&this->builder,id,"img");
    spv::Builder::addName(&this->builder,id_00,"coord");
    spv::Builder::addName(&this->builder,id_01,"value");
    sVar7 = (size_t)IVar1;
    spv::Builder::addName(&this->builder,IVar1,"active_lane");
    pBVar3 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(pBVar3,IVar2,local_70);
    this_01 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(this_01,IVar2,local_70);
    this_02 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(this_02,IVar2,local_70);
    this_03 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(this_03,IVar2,local_70);
    this_04 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(this_04,IVar2,local_70);
    thenBlock = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(thenBlock,IVar2,local_70);
    mergeBlock = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(mergeBlock,IVar2,local_70);
    bp = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar2;
    spv::Block::Block(bp,IVar2,local_70);
    elseBlock = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(elseBlock,IVar2,local_70);
    spv::Builder::setBuildPoint(&this->builder,_int_type);
    spv::Builder::createSelectionMerge(&this->builder,this_01,0);
    spv::Builder::createConditionalBranch(&this->builder,IVar1,pBVar3,this_01);
    IVar1 = coord_type;
    IVar2 = spv::Builder::makeBoolConstant(&this->builder,false,false);
    load._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::createVariableWithInitializer
                   (&this->builder,StorageClassFunction,IVar1,IVar2,"is_done");
    spv::Builder::setBuildPoint(&this->builder,pBVar3);
    inot._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    inot._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x3d;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_130,
               (uint *)((long)&inot._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &coord_type);
    inot_id = spv::Builder::getUniqueId(&this->builder);
    local_148 = 0xa8;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_140,&inot_id,&coord_type);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_140);
    local_14c = spv::Instruction::getResultId(pIVar4);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_130);
    spv::Instruction::addIdOperand
              (pIVar4,load._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_140);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_130);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_158,&local_130);
    add_instruction(this,pBVar3,&local_158);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_158);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&first,&local_140);
    add_instruction(this,pBVar3,&first);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&first);
    spv::Builder::createLoopMerge(&this->builder,this_02,this_04,0);
    spv::Builder::createConditionalBranch(&this->builder,local_14c,this_03,this_02);
    spv::Builder::setBuildPoint(&this->builder,this_03);
    compare_coord._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    compare_coord._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x152;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_168,
               (uint *)((long)&compare_coord._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &u64_type);
    all_equal._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    all_equal._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xaa;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_178,
               (uint *)((long)&all_equal._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &ptr_atomic_type);
    store._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    store._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x9b;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_188,
               (uint *)((long)&store._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &coord_type);
    local_19c = 0x3e;
    std::make_unique<spv::Instruction,spv::Op>(&cond_id);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_168);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_168);
    spv::Instruction::addIdOperand(pIVar4,id_00);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    spv::Instruction::addIdOperand(pIVar4,id_00);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_168);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_188);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &cond_id);
    spv::Instruction::addIdOperand
              (pIVar4,load._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &cond_id);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_188);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_188);
    local_1a0 = spv::Instruction::getResultId(pIVar4);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1a8,&local_168);
    add_instruction(this,this_03,&local_1a8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1a8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1b0,&local_178);
    add_instruction(this,this_03,&local_1b0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1b0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1b8,&local_188);
    add_instruction(this,this_03,&local_1b8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1b8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&or_op,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &cond_id);
    add_instruction(this,this_03,&or_op);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&or_op);
    spv::Builder::createSelectionMerge(&this->builder,mergeBlock,0);
    spv::Builder::createConditionalBranch(&this->builder,local_1a0,thenBlock,mergeBlock);
    spv::Builder::setBuildPoint(&this->builder,thenBlock);
    elect._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    elect._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x168;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_1c8,
               (uint *)((long)&elect._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               (Op *)((long)&func + 4));
    elect_id = spv::Builder::getUniqueId(&this->builder);
    or_op_id = 0x14d;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_1d8,&elect_id,&coord_type);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1c8);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1c8);
    spv::Instruction::addImmediateOperand(pIVar4,0);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1c8);
    spv::Instruction::addIdOperand(pIVar4,id_01);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1d8);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1d8);
    local_1e4 = spv::Instruction::getResultId(pIVar4);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1c8);
    local_1e8 = spv::Instruction::getResultId(pIVar4);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1f0,&local_1c8);
    add_instruction(this,thenBlock,&local_1f0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1f0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&texel,&local_1d8);
    add_instruction(this,thenBlock,&texel);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&texel);
    spv::Builder::createSelectionMerge(&this->builder,elseBlock,0);
    spv::Builder::createConditionalBranch(&this->builder,local_1e4,bp,elseBlock);
    spv::Builder::setBuildPoint(&this->builder,bp);
    atomic_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    atomic_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x3c;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_200,
               (uint *)((long)&atomic_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               (Op *)&func);
    if ((call_id._6_1_ & 1) != 0) {
      pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_200);
      IVar1 = spv::Instruction::getResultId(pIVar4);
      spv::Builder::addDecoration(&this->builder,IVar1,DecorationNonUniform,-1);
    }
    local_214 = spv::Builder::getUniqueId(&this->builder);
    local_218 = 0xf1;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_210,&local_214,(Op *)((long)&func + 4));
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_200);
    spv::Instruction::addIdOperand(pIVar4,id);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_200);
    spv::Instruction::addIdOperand(pIVar4,id_00);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_200);
    IVar1 = spv::Builder::makeIntConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_210);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_200);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_210);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_210);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_210);
    spv::Instruction::addIdOperand(pIVar4,local_1e8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_220,&local_200);
    add_instruction(this,bp,&local_220);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_220);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_228,&local_210);
    add_instruction(this,bp,&local_228);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_228);
    spv::Builder::createBranch(&this->builder,elseBlock);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_210);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_200);
    spv::Builder::setBuildPoint(&this->builder,elseBlock);
    spv::Builder::createBranch(&this->builder,mergeBlock);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1d8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1c8);
    spv::Builder::setBuildPoint(&this->builder,mergeBlock);
    spv::Builder::createBranch(&this->builder,this_04);
    spv::Builder::setBuildPoint(&this->builder,this_04);
    spv::Builder::createBranch(&this->builder,pBVar3);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&cond_id);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_188);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_178);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_168);
    spv::Builder::setBuildPoint(&this->builder,this_02);
    spv::Builder::createBranch(&this->builder,this_01);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_140);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_130);
    spv::Builder::setBuildPoint(&this->builder,this_01);
    spv::Builder::makeReturn(&this->builder,false,0);
    spv::Builder::addCapability(&this->builder,CapabilityInt64Atomics);
    spv::Builder::setBuildPoint(&this->builder,_ptr_image_type);
    IVar1 = spv::Function::getId(local_70);
    *(Id *)name = IVar1;
    this_local._4_4_ = spv::Function::getId(local_70);
  }
  else {
    this_local._4_4_ = *(Id *)name;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_image_atomic_r64_compact(
	SPIRVModule &module, bool array, bool non_uniform)
{
	spv::Id *call_id;
	const char *name;
	if (array)
	{
		if (non_uniform)
		{
			call_id = &image_r64_array_atomic_non_uniform_call_id;
			name = "WriteFeedbackArrayNonUniform";
		}
		else
		{
			call_id = &image_r64_array_atomic_call_id;
			name = "WriteFeedbackArray";
		}
	}
	else
	{
		if (non_uniform)
		{
			call_id = &image_r64_atomic_non_uniform_call_id;
			name = "WriteFeedbackNonUniform";
		}
		else
		{
			call_id = &image_r64_atomic_call_id;
			name = "WriteFeedback";
		}
	}

	if (*call_id)
		return *call_id;

	builder.addCapability(spv::CapabilityGroupNonUniform);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	auto *current_build_point = builder.getBuildPoint();

	spv::Id image_type = builder.makeImageType(builder.makeUintType(64),
	                                           spv::Dim2D, false, array, false, 2, spv::ImageFormatR64ui);
	spv::Id ptr_image_type = builder.makePointer(spv::StorageClassUniformConstant, image_type);

	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id int_type = builder.makeIntType(32);
	spv::Id coord_type = builder.makeVectorType(int_type, array ? 3 : 2);
	spv::Id bvec_type = builder.makeVectorType(bool_type, array ? 3 : 2);
	spv::Id u64_type = builder.makeUintType(64);
	spv::Id ptr_atomic_type = builder.makePointer(spv::StorageClassImage, u64_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(), name,
	                                       { ptr_image_type, coord_type, u64_type, bool_type }, {}, &entry);

	spv::Id image_ptr = func->getParamId(0);
	spv::Id coord = func->getParamId(1);
	spv::Id value = func->getParamId(2);
	spv::Id active = func->getParamId(3);

	builder.addName(image_ptr, "img");
	builder.addName(coord, "coord");
	builder.addName(value, "value");
	builder.addName(active, "active_lane");

	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *loop_merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *loop_body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *loop_continue_block = new spv::Block(builder.getUniqueId(), *func);
	auto *write_block = new spv::Block(builder.getUniqueId(), *func);
	auto *write_merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *elect_block = new spv::Block(builder.getUniqueId(), *func);
	auto *elect_merge_block = new spv::Block(builder.getUniqueId(), *func);

	builder.setBuildPoint(entry);
	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(active, body_block, merge_block);

	spv::Id var_is_done = builder.createVariableWithInitializer(spv::StorageClassFunction, bool_type,
	                                                            builder.makeBoolConstant(false), "is_done");

	builder.setBuildPoint(body_block);
	{
		auto load = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLoad);
		auto inot = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpLogicalNot);
		spv::Id inot_id = inot->getResultId();
		load->addIdOperand(var_is_done);
		inot->addIdOperand(load->getResultId());
		add_instruction(body_block, std::move(load));
		add_instruction(body_block, std::move(inot));
		builder.createLoopMerge(loop_merge_block, loop_continue_block, 0);
		builder.createConditionalBranch(inot_id, loop_body_block, loop_merge_block);

		builder.setBuildPoint(loop_body_block);
		{
			auto first = std::make_unique<spv::Instruction>(builder.getUniqueId(), coord_type, spv::OpGroupNonUniformBroadcastFirst);
			auto compare_coord = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec_type, spv::OpIEqual);
			auto all_equal = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAll);
			auto store = std::make_unique<spv::Instruction>(spv::OpStore);

			first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
			first->addIdOperand(coord);
			compare_coord->addIdOperand(coord);
			compare_coord->addIdOperand(first->getResultId());
			all_equal->addIdOperand(compare_coord->getResultId());
			store->addIdOperand(var_is_done);
			store->addIdOperand(all_equal->getResultId());

			spv::Id cond_id = all_equal->getResultId();
			add_instruction(loop_body_block, std::move(first));
			add_instruction(loop_body_block, std::move(compare_coord));
			add_instruction(loop_body_block, std::move(all_equal));
			add_instruction(loop_body_block, std::move(store));

			builder.createSelectionMerge(write_merge_block, 0);
			builder.createConditionalBranch(cond_id, write_block, write_merge_block);
			builder.setBuildPoint(write_block);
			{
				auto or_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), u64_type, spv::OpGroupNonUniformBitwiseOr);
				auto elect = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformElect);
				or_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
				or_op->addImmediateOperand(spv::GroupOperationReduce);
				or_op->addIdOperand(value);
				elect->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
				spv::Id elect_id = elect->getResultId();
				spv::Id or_op_id = or_op->getResultId();
				add_instruction(write_block, std::move(or_op));
				add_instruction(write_block, std::move(elect));

				builder.createSelectionMerge(elect_merge_block, 0);
				builder.createConditionalBranch(elect_id, elect_block, elect_merge_block);
				builder.setBuildPoint(elect_block);
				{
					auto texel = std::make_unique<spv::Instruction>(builder.getUniqueId(), ptr_atomic_type, spv::OpImageTexelPointer);
					if (non_uniform)
						builder.addDecoration(texel->getResultId(), spv::DecorationNonUniform);
					auto atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), u64_type, spv::OpAtomicOr);
					texel->addIdOperand(image_ptr);
					texel->addIdOperand(coord);
					texel->addIdOperand(builder.makeIntConstant(0));
					atomic_op->addIdOperand(texel->getResultId());
					atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
					atomic_op->addIdOperand(builder.makeUintConstant(0));
					atomic_op->addIdOperand(or_op_id);
					add_instruction(elect_block, std::move(texel));
					add_instruction(elect_block, std::move(atomic_op));
					builder.createBranch(elect_merge_block);
				}

				builder.setBuildPoint(elect_merge_block);
				builder.createBranch(write_merge_block);
			}

			builder.setBuildPoint(write_merge_block);
			builder.createBranch(loop_continue_block);

			builder.setBuildPoint(loop_continue_block);
			builder.createBranch(body_block);
		}

		builder.setBuildPoint(loop_merge_block);
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	builder.makeReturn(false);

	builder.addCapability(spv::CapabilityInt64Atomics);

	builder.setBuildPoint(current_build_point);
	*call_id = func->getId();
	return func->getId();
}